

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5SegIterNext(Fts5Index *p,Fts5SegIter *pIter,int *pbNewTerm)

{
  u8 *puVar1;
  ushort *puVar2;
  Fts5Hash *pHash;
  bool bVar3;
  u8 *pData;
  byte bVar4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  int iVar9;
  ulong uVar10;
  Fts5Data *pFVar11;
  u64 iDelta;
  int nList;
  int nKeep;
  char *zTerm;
  u8 *local_60;
  int local_58;
  u32 local_54;
  u8 *local_50;
  int *local_48;
  int *local_40;
  i64 *local_38;
  
  pFVar11 = pIter->pLeaf;
  local_54 = 0;
  uVar10 = (long)pIter->nPos + (long)pIter->iLeafOffset;
  iVar9 = (int)uVar10;
  local_48 = pbNewTerm;
  if (iVar9 < pFVar11->szLeaf) {
    puVar1 = pFVar11->p;
    if (iVar9 < pIter->iEndofDoclist) {
      bVar4 = sqlite3Fts5GetVarint(puVar1 + iVar9,(u64 *)&local_60);
      pIter->iRowid = (i64)(local_60 + pIter->iRowid);
      uVar6 = (uint)bVar4;
      bVar3 = false;
LAB_001cc457:
      uVar10 = (ulong)(uVar6 + iVar9);
    }
    else {
      sqlite3Fts5GetVarint32(puVar1 + pFVar11->szLeaf,(u32 *)&local_60);
      bVar3 = true;
      if (iVar9 != (uint)local_60) {
        uVar6 = sqlite3Fts5GetVarint32(puVar1 + uVar10,&local_54);
        goto LAB_001cc457;
      }
    }
    pIter->iLeafOffset = (int)uVar10;
  }
  else {
    if (pIter->pSeg == (Fts5StructureSegment *)0x0) {
      local_60 = (uchar *)0x0;
      local_50 = (u8 *)0x0;
      local_58 = 0;
      if ((pIter->flags & 1) == 0) {
        pHash = p->pHash;
        pHash->pScan = pHash->pScan->pScanNext;
        sqlite3Fts5HashScanEntry(pHash,(char **)&local_50,&local_60,&local_58);
        pData = local_50;
        puVar1 = local_60;
        if (local_60 != (uchar *)0x0) {
          pFVar11 = pIter->pLeaf;
          pFVar11->p = local_60;
          pFVar11->nn = local_58;
          pFVar11->szLeaf = local_58;
          pIter->iEndofDoclist = local_58 + 1;
          sVar8 = strlen((char *)local_50);
          (pIter->term).n = 0;
          sqlite3Fts5BufferAppendBlob(&p->rc,&pIter->term,(u32)sVar8,pData);
          bVar4 = sqlite3Fts5GetVarint(puVar1,(u64 *)&pIter->iRowid);
          pIter->iLeafOffset = (uint)bVar4;
          *local_48 = 1;
          pFVar11 = pIter->pLeaf;
          if (pFVar11 == (Fts5Data *)0x0) {
            return;
          }
          goto LAB_001cc561;
        }
      }
      pFVar11 = pIter->pLeaf;
      goto LAB_001cc5b2;
    }
    local_38 = &pIter->iRowid;
    local_40 = &pIter->iEndofDoclist;
    uVar6 = 0;
    bVar3 = false;
    while (uVar6 == 0) {
      fts5SegIterNextPage(p,pIter);
      pFVar11 = pIter->pLeaf;
      if (pFVar11 == (Fts5Data *)0x0) {
        return;
      }
      puVar2 = (ushort *)pFVar11->p;
      uVar5 = *puVar2 << 8 | *puVar2 >> 8;
      local_60 = (u8 *)CONCAT44(local_60._4_4_,(uint)uVar5);
      iVar9 = pFVar11->szLeaf;
      uVar6 = (uint)uVar5;
      if ((int)uVar6 < iVar9 && uVar5 != 0) {
        bVar4 = sqlite3Fts5GetVarint((uchar *)((long)puVar2 + (ulong)uVar5),(u64 *)local_38);
        uVar6 = bVar4 + uVar6;
        local_60 = (u8 *)CONCAT44(local_60._4_4_,uVar6);
        pIter->iLeafOffset = uVar6;
        iVar9 = pFVar11->szLeaf;
        if (iVar9 < pFVar11->nn) {
          iVar7 = sqlite3Fts5GetVarint32(pFVar11->p + iVar9,(u32 *)local_40);
          pIter->iPgidxOff = iVar9 + iVar7;
          iVar9 = pFVar11->szLeaf;
        }
      }
      else if (iVar9 < pFVar11->nn) {
        iVar7 = sqlite3Fts5GetVarint32((uchar *)((long)puVar2 + (long)iVar9),(u32 *)&local_60);
        pIter->iPgidxOff = iVar7 + iVar9;
        pIter->iLeafOffset = (uint)local_60;
        pIter->iEndofDoclist = (uint)local_60;
        bVar3 = true;
        uVar6 = (uint)local_60;
      }
      if (iVar9 < (int)uVar6) {
        p->rc = 0x10b;
        return;
      }
    }
    pFVar11 = pIter->pLeaf;
    if (pFVar11 == (Fts5Data *)0x0) {
      return;
    }
  }
  if (!bVar3) {
LAB_001cc561:
    puVar1 = pFVar11->p;
    iVar9 = pIter->iLeafOffset;
    pIter->iLeafOffset = iVar9 + 1;
    bVar4 = puVar1[iVar9];
    local_50 = (u8 *)CONCAT44(local_50._4_4_,(uint)bVar4);
    uVar6 = (uint)bVar4;
    if ((char)bVar4 < '\0') {
      pIter->iLeafOffset = iVar9;
      iVar7 = sqlite3Fts5GetVarint32(puVar1 + iVar9,(u32 *)&local_50);
      pIter->iLeafOffset = iVar7 + iVar9;
      uVar6 = (uint)local_50;
    }
    pIter->bDel = (byte)uVar6 & 1;
    pIter->nPos = (int)uVar6 >> 1;
    return;
  }
  if ((pIter->flags & 1) == 0) {
    fts5SegIterLoadTerm(p,pIter,local_54);
    fts5SegIterLoadNPos(p,pIter);
    if (local_48 == (int *)0x0) {
      return;
    }
    *local_48 = 1;
    return;
  }
LAB_001cc5b2:
  sqlite3_free(pFVar11);
  pIter->pLeaf = (Fts5Data *)0x0;
  return;
}

Assistant:

static void fts5SegIterNext(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5SegIter *pIter,             /* Iterator to advance */
  int *pbNewTerm                  /* OUT: Set for new term */
){
  Fts5Data *pLeaf = pIter->pLeaf;
  int iOff;
  int bNewTerm = 0;
  int nKeep = 0;
  u8 *a;
  int n;

  assert( pbNewTerm==0 || *pbNewTerm==0 );
  assert( p->pConfig->eDetail!=FTS5_DETAIL_NONE );

  /* Search for the end of the position list within the current page. */
  a = pLeaf->p;
  n = pLeaf->szLeaf;

  ASSERT_SZLEAF_OK(pLeaf);
  iOff = pIter->iLeafOffset + pIter->nPos;

  if( iOff<n ){
    /* The next entry is on the current page. */
    assert_nc( iOff<=pIter->iEndofDoclist );
    if( iOff>=pIter->iEndofDoclist ){
      bNewTerm = 1;
      if( iOff!=fts5LeafFirstTermOff(pLeaf) ){
        iOff += fts5GetVarint32(&a[iOff], nKeep);
      }
    }else{
      u64 iDelta;
      iOff += sqlite3Fts5GetVarint(&a[iOff], &iDelta);
      pIter->iRowid += iDelta;
      assert_nc( iDelta>0 );
    }
    pIter->iLeafOffset = iOff;

  }else if( pIter->pSeg==0 ){
    const u8 *pList = 0;
    const char *zTerm = 0;
    int nList = 0;
    assert( (pIter->flags & FTS5_SEGITER_ONETERM) || pbNewTerm );
    if( 0==(pIter->flags & FTS5_SEGITER_ONETERM) ){
      sqlite3Fts5HashScanNext(p->pHash);
      sqlite3Fts5HashScanEntry(p->pHash, &zTerm, &pList, &nList);
    }
    if( pList==0 ){
      fts5DataRelease(pIter->pLeaf);
      pIter->pLeaf = 0;
    }else{
      pIter->pLeaf->p = (u8*)pList;
      pIter->pLeaf->nn = nList;
      pIter->pLeaf->szLeaf = nList;
      pIter->iEndofDoclist = nList+1;
      sqlite3Fts5BufferSet(&p->rc, &pIter->term, (int)strlen(zTerm),
          (u8*)zTerm);
      pIter->iLeafOffset = fts5GetVarint(pList, (u64*)&pIter->iRowid);
      *pbNewTerm = 1;
    }
  }else{
    iOff = 0;
    /* Next entry is not on the current page */
    while( iOff==0 ){
      fts5SegIterNextPage(p, pIter);
      pLeaf = pIter->pLeaf;
      if( pLeaf==0 ) break;
      ASSERT_SZLEAF_OK(pLeaf);
      if( (iOff = fts5LeafFirstRowidOff(pLeaf)) && iOff<pLeaf->szLeaf ){
        iOff += sqlite3Fts5GetVarint(&pLeaf->p[iOff], (u64*)&pIter->iRowid);
        pIter->iLeafOffset = iOff;

        if( pLeaf->nn>pLeaf->szLeaf ){
          pIter->iPgidxOff = pLeaf->szLeaf + fts5GetVarint32(
              &pLeaf->p[pLeaf->szLeaf], pIter->iEndofDoclist
          );
        }
      }
      else if( pLeaf->nn>pLeaf->szLeaf ){
        pIter->iPgidxOff = pLeaf->szLeaf + fts5GetVarint32(
            &pLeaf->p[pLeaf->szLeaf], iOff
        );
        pIter->iLeafOffset = iOff;
        pIter->iEndofDoclist = iOff;
        bNewTerm = 1;
      }
      assert_nc( iOff<pLeaf->szLeaf );
      if( iOff>pLeaf->szLeaf ){
        p->rc = FTS5_CORRUPT;
        return;
      }
    }
  }

  /* Check if the iterator is now at EOF. If so, return early. */
  if( pIter->pLeaf ){
    if( bNewTerm ){
      if( pIter->flags & FTS5_SEGITER_ONETERM ){
        fts5DataRelease(pIter->pLeaf);
        pIter->pLeaf = 0;
      }else{
        fts5SegIterLoadTerm(p, pIter, nKeep);
        fts5SegIterLoadNPos(p, pIter);
        if( pbNewTerm ) *pbNewTerm = 1;
      }
    }else{
      /* The following could be done by calling fts5SegIterLoadNPos(). But
      ** this block is particularly performance critical, so equivalent
      ** code is inlined. 
      **
      ** Later: Switched back to fts5SegIterLoadNPos() because it supports
      ** detail=none mode. Not ideal.
      */
      int nSz;
      assert( p->rc==SQLITE_OK );
      assert( pIter->iLeafOffset<=pIter->pLeaf->nn );
      fts5FastGetVarint32(pIter->pLeaf->p, pIter->iLeafOffset, nSz);
      pIter->bDel = (nSz & 0x0001);
      pIter->nPos = nSz>>1;
      assert_nc( pIter->nPos>=0 );
    }
  }
}